

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThanEquals,bool>
               (string_t *ldata,string_t *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  bool bVar1;
  idx_t iVar2;
  idx_t iVar3;
  idx_t i_1;
  idx_t i;
  idx_t iVar4;
  string_t left;
  string_t left_00;
  string_t right;
  string_t right_00;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
      iVar2 = iVar4;
      if (lsel->sel_vector != (sel_t *)0x0) {
        iVar2 = (idx_t)lsel->sel_vector[iVar4];
      }
      iVar3 = iVar4;
      if (rsel->sel_vector != (sel_t *)0x0) {
        iVar3 = (idx_t)rsel->sel_vector[iVar4];
      }
      left.value.pointer.ptr = ldata[iVar2].value.pointer.ptr;
      left.value._0_8_ = *(undefined8 *)&ldata[iVar2].value;
      right.value.pointer.ptr = rdata[iVar3].value.pointer.ptr;
      right.value._0_8_ = *(undefined8 *)&rdata[iVar3].value;
      bVar1 = BinarySingleArgumentOperatorWrapper::
              Operation<bool,duckdb::GreaterThanEquals,duckdb::string_t,duckdb::string_t,bool>
                        (fun,left,right,result_validity,iVar4);
      result_data[iVar4] = bVar1;
    }
  }
  else {
    for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
      iVar2 = iVar4;
      if (lsel->sel_vector != (sel_t *)0x0) {
        iVar2 = (idx_t)lsel->sel_vector[iVar4];
      }
      iVar3 = iVar4;
      if (rsel->sel_vector != (sel_t *)0x0) {
        iVar3 = (idx_t)rsel->sel_vector[iVar4];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&lvalidity->super_TemplatedValidityMask<unsigned_long>,iVar2);
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&rvalidity->super_TemplatedValidityMask<unsigned_long>,iVar3);
        if (!bVar1) goto LAB_0175d3e8;
        left_00.value.pointer.ptr = ldata[iVar2].value.pointer.ptr;
        left_00.value._0_8_ = *(undefined8 *)&ldata[iVar2].value;
        right_00.value.pointer.ptr = rdata[iVar3].value.pointer.ptr;
        right_00.value._0_8_ = *(undefined8 *)&rdata[iVar3].value;
        bVar1 = BinarySingleArgumentOperatorWrapper::
                Operation<bool,duckdb::GreaterThanEquals,duckdb::string_t,duckdb::string_t,bool>
                          (fun,left_00,right_00,result_validity,iVar4);
        result_data[iVar4] = bVar1;
      }
      else {
LAB_0175d3e8:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,iVar4);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}